

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArray.h
# Opt level: O3

void __thiscall
SparseArray<float,_512UL>::insert(SparseArray<float,_512UL> *this,HaU32 key,float *value)

{
  HashEntry *pHVar1;
  HashEntry *pHVar2;
  uint uVar3;
  HashEntry *next;
  
  uVar3 = this->mHashTableCount;
  if (uVar3 < this->mMaxEntries) {
    pHVar2 = this->mFreeList;
    if (pHVar2 == (HashEntry *)0x0) {
      pHVar2 = this->mEntries + uVar3;
      this->mHashTableCount = uVar3 + 1;
      if (this->mMaxEntries <= uVar3 + 1) {
        __assert_fail("mHashTableCount < mMaxEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/SparseArray.h"
                      ,0x95,
                      "void SparseArray<float>::insert(HaU32, const Value &) [Value = float, hashTableSize = 512]"
                     );
      }
    }
    else {
      this->mFreeList = pHVar2->mNext;
      pHVar2->mNext = (HashEntry *)0x0;
    }
    pHVar2->mKey = key;
    uVar3 = ~(key << 0xf) + key;
    uVar3 = (uVar3 >> 10 ^ uVar3) * 9;
    uVar3 = uVar3 >> 6 ^ uVar3;
    pHVar2->mValue = *value;
    uVar3 = ~(uVar3 << 0xb) + uVar3;
    uVar3 = (uVar3 >> 0x10 ^ uVar3) & 0x1ff;
    pHVar1 = this->mHashTable[uVar3];
    this->mHashTable[uVar3] = pHVar2;
    if (pHVar1 != (HashEntry *)0x0) {
      pHVar2->mNext = pHVar1;
    }
  }
  return;
}

Assistant:

void insert(HaU32 key, const Value& value)
	{
		if (mHashTableCount < mMaxEntries )
		{
			HashEntry* h;
			if ( mFreeList ) // if there are previously freed hash entry items
			{
				h = mFreeList;
				mFreeList = h->mNext;
				h->mNext = NULL;
			}
			else
			{
				h = &mEntries[mHashTableCount];
				mHashTableCount++;
				HACD_ASSERT( mHashTableCount < mMaxEntries );
			}

			h->mKey = key;
			h->mValue = value;
			HaU32 hash = getHash(key);
			if (mHashTable[hash])
			{
				HashEntry* next = mHashTable[hash];
				mHashTable[hash] = h;
				h->mNext = next;
			}
			else
			{
				mHashTable[hash] = h;
			}
		}
	}